

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams
          (LinearQuantizationParams *this,LinearQuantizationParams *from)

{
  int iVar1;
  void *pvVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__LinearQuantizationParams_00723fc8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->scale_).current_size_ = 0;
  (this->scale_).total_size_ = 0;
  (this->scale_).rep_ = (Rep *)0x0;
  iVar1 = (from->scale_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->scale_,iVar1);
    memcpy(((this->scale_).rep_)->elements,((from->scale_).rep_)->elements,
           (long)(from->scale_).current_size_ << 2);
    (this->scale_).current_size_ = (from->scale_).current_size_;
  }
  (this->bias_).current_size_ = 0;
  (this->bias_).total_size_ = 0;
  (this->bias_).rep_ = (Rep *)0x0;
  iVar1 = (from->bias_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->bias_,iVar1);
    memcpy(((this->bias_).rep_)->elements,((from->bias_).rep_)->elements,
           (long)(from->bias_).current_size_ << 2);
    (this->bias_).current_size_ = (from->bias_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

LinearQuantizationParams::LinearQuantizationParams(const LinearQuantizationParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      scale_(from.scale_),
      bias_(from.bias_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LinearQuantizationParams)
}